

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86func.cpp
# Opt level: O0

Error asmjit::v1_14::x86::FuncInternal::initFuncDetail
                (FuncDetail *func,FuncSignature *signature,uint32_t registerSize)

{
  uint uVar1;
  bool bVar2;
  Error EVar3;
  RegOrder *pRVar4;
  FuncValue *pFVar5;
  uint32_t in_stack_fffffffffffffb18;
  int32_t in_stack_fffffffffffffb1c;
  undefined3 uVar6;
  uint in_stack_fffffffffffffb20;
  undefined1 in_stack_fffffffffffffb24;
  undefined1 in_stack_fffffffffffffb25;
  undefined1 in_stack_fffffffffffffb26;
  undefined1 in_stack_fffffffffffffb27;
  bool local_4d8;
  bool local_4d7;
  RegType local_4d5;
  bool local_4d2;
  bool local_4d1;
  undefined8 in_stack_fffffffffffffb30;
  undefined5 in_stack_fffffffffffffb38;
  undefined1 in_stack_fffffffffffffb3d;
  undefined1 in_stack_fffffffffffffb3e;
  undefined1 in_stack_fffffffffffffb3f;
  bool local_4b3;
  uint local_4b0;
  RegType local_4aa;
  bool local_4a9;
  byte local_49a;
  byte local_499;
  uint local_488;
  RegType local_481;
  uint32_t gpRegId;
  RegType regType_4;
  uint32_t regId_3;
  RegType regType_3;
  undefined1 local_42d;
  uint32_t regId_2;
  uint32_t size_2;
  TypeId typeId_2;
  FuncValue *arg_1;
  uint32_t valueIndex_2;
  uint32_t argIndex_1;
  bool isVectorCall;
  uint32_t size_1;
  undefined1 local_401;
  uint32_t regId_1;
  uint local_3fc;
  uint32_t size;
  RegType regType_2;
  undefined1 local_3f1;
  uint32_t regId;
  TypeId typeId_1;
  FuncValue *arg;
  uint32_t valueIndex_1;
  uint32_t argIndex;
  uint32_t vecPos;
  uint32_t gpzPos;
  uint32_t regIndex;
  RegType regType_1;
  RegType regType;
  TypeId typeId;
  uint32_t valueIndex;
  uint32_t argCount;
  uint32_t stackOffset;
  Arch arch;
  CallConv *cc;
  uint32_t registerSize_local;
  FuncSignature *signature_local;
  FuncDetail *func_local;
  FuncValue *local_390;
  FuncValue *local_388;
  FuncValue *local_380;
  Arch local_371;
  FuncDetail *local_370;
  FuncDetail *local_368;
  TypeId local_359;
  FuncValue *local_358;
  FuncDetail *local_350;
  FuncDetail *local_348;
  undefined4 local_340;
  TypeId local_339;
  uint32_t local_338;
  byte local_331;
  FuncValue *local_330;
  undefined4 local_328;
  TypeId local_321;
  uint32_t local_320;
  RegType local_319;
  FuncValue *local_318;
  undefined4 local_310;
  TypeId local_309;
  uint32_t local_308;
  undefined1 local_301;
  FuncValue *local_300;
  undefined4 local_2f8;
  TypeId local_2f1;
  uint32_t local_2f0;
  RegType local_2e9;
  FuncValue *local_2e8;
  undefined4 local_2e0;
  undefined1 local_2d9;
  uint local_2d8;
  undefined1 local_2d1;
  FuncValue *local_2d0;
  undefined4 local_2c8;
  undefined1 local_2c1;
  uint local_2c0;
  undefined1 local_2b9;
  FuncValue *local_2b8;
  undefined4 local_2b0;
  TypeId local_2a9;
  uint local_2a8;
  undefined1 local_2a1;
  FuncValue *local_2a0;
  Arch local_291;
  CallConv *local_290;
  CallConv *local_288;
  CallConv *local_280;
  CallConv *local_278;
  TypeId local_26b;
  TypeId local_26a;
  TypeId local_269;
  FuncValue *local_268;
  FuncValue *local_260;
  FuncValue *local_258;
  TypeId local_24c;
  TypeId local_24b;
  undefined1 local_24a;
  TypeId local_249;
  uint32_t *local_248;
  uint32_t *local_240;
  uint32_t *local_238;
  uint32_t *local_230;
  uint32_t *local_228;
  uint *local_220;
  TypeId local_216;
  TypeId local_215;
  TypeId local_214;
  TypeId local_213;
  TypeId local_212;
  TypeId local_211;
  TypeId local_210;
  TypeId local_20f;
  TypeId local_20e;
  TypeId local_20d;
  undefined4 local_20c;
  CallConv *local_208;
  undefined4 local_1fc;
  CallConv *local_1f8;
  FuncSignature *local_1f0;
  TypeId local_1e6;
  TypeId local_1e5;
  undefined4 local_1e4;
  FuncValue *local_1e0;
  undefined4 local_1d8;
  undefined4 local_1d4;
  uint local_1d0;
  undefined1 local_1cb;
  undefined1 local_1ca;
  TypeId local_1c9;
  undefined4 local_1c8;
  undefined4 local_1c4;
  uint local_1c0;
  undefined1 local_1bb;
  undefined1 local_1ba;
  TypeId local_1b9;
  undefined4 local_1b8;
  undefined4 local_1b4;
  uint local_1b0;
  undefined1 local_1ab;
  undefined1 local_1aa;
  TypeId local_1a9;
  undefined4 local_1a8;
  undefined4 local_1a4;
  uint local_1a0;
  undefined1 local_19b;
  undefined1 local_19a;
  TypeId local_199;
  undefined4 local_198;
  undefined4 local_194;
  uint local_190;
  undefined1 local_18b;
  undefined1 local_18a;
  TypeId local_189;
  undefined4 local_188;
  undefined4 local_184;
  uint local_180;
  undefined1 local_17b;
  undefined1 local_17a;
  TypeId local_179;
  undefined4 local_178;
  undefined4 local_174;
  uint local_170;
  undefined1 local_16b;
  undefined1 local_16a;
  TypeId local_169;
  undefined4 local_168;
  undefined4 local_164;
  uint local_160;
  undefined1 local_15b;
  undefined1 local_15a;
  TypeId local_159;
  undefined4 local_158;
  undefined4 local_154;
  uint local_150;
  undefined1 local_14b;
  undefined1 local_14a;
  TypeId local_149;
  undefined4 local_148;
  undefined4 local_144;
  uint local_140;
  undefined1 local_13b;
  undefined1 local_13a;
  TypeId local_139;
  undefined4 local_138;
  undefined4 local_134;
  uint local_130;
  undefined1 local_12b;
  undefined1 local_12a;
  TypeId local_129;
  undefined4 *local_128;
  undefined4 *local_120;
  uint *local_118;
  undefined4 *local_110;
  undefined4 *local_108;
  uint *local_100;
  undefined4 *local_f8;
  undefined4 *local_f0;
  uint *local_e8;
  undefined4 *local_e0;
  undefined4 *local_d8;
  uint *local_d0;
  undefined4 *local_c8;
  undefined4 *local_c0;
  uint *local_b8;
  undefined4 *local_b0;
  undefined4 *local_a8;
  uint *local_a0;
  undefined4 *local_98;
  undefined4 *local_90;
  uint *local_88;
  undefined4 *local_80;
  undefined4 *local_78;
  uint *local_70;
  undefined4 *local_68;
  undefined4 *local_60;
  uint *local_58;
  undefined4 *local_50;
  undefined4 *local_48;
  uint *local_40;
  undefined4 *local_38;
  undefined4 *local_30;
  uint *local_28;
  uint32_t *local_20;
  uint32_t *local_18;
  uint32_t *local_10;
  uint32_t *local_8;
  
  arch = *(Arch *)func;
  stackOffset = (uint32_t)(byte)func[4];
  argCount = (uint32_t)(byte)func[0x74];
  cc = (CallConv *)func;
  registerSize_local = registerSize;
  signature_local = signature;
  func_local = func;
  local_370 = func;
  local_368 = func;
  local_350 = func;
  local_348 = func;
  local_268 = FuncValuePack::operator[]
                        ((FuncValuePack *)
                         CONCAT17(in_stack_fffffffffffffb27,
                                  CONCAT16(in_stack_fffffffffffffb26,
                                           CONCAT15(in_stack_fffffffffffffb25,
                                                    CONCAT14(in_stack_fffffffffffffb24,
                                                             in_stack_fffffffffffffb20)))),
                         CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  if (local_268->_data != 0) {
    unpackValues(func_local,(FuncValuePack *)(func_local + 0x8c));
    for (valueIndex = 0; valueIndex < 4; valueIndex = valueIndex + 1) {
      local_380 = FuncValuePack::operator[]
                            ((FuncValuePack *)
                             CONCAT17(in_stack_fffffffffffffb27,
                                      CONCAT16(in_stack_fffffffffffffb26,
                                               CONCAT15(in_stack_fffffffffffffb25,
                                                        CONCAT14(in_stack_fffffffffffffb24,
                                                                 in_stack_fffffffffffffb20)))),
                             CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
      typeId = (TypeId)local_380->_data;
      if (typeId == kVoid) break;
      switch(typeId) {
      case kInt8:
      case kInt16:
      case kInt32:
        if (""[valueIndex] == 0xff) {
          EVar3 = DebugUtils::errored(3);
          return EVar3;
        }
        local_2b8 = FuncValuePack::operator[]
                              ((FuncValuePack *)
                               CONCAT17(in_stack_fffffffffffffb27,
                                        CONCAT16(in_stack_fffffffffffffb26,
                                                 CONCAT15(in_stack_fffffffffffffb25,
                                                          CONCAT14(in_stack_fffffffffffffb24,
                                                                   in_stack_fffffffffffffb20)))),
                               CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
        local_2b9 = 6;
        local_2c0 = (uint)""[valueIndex];
        local_2c1 = 0x26;
        local_2c8 = 0;
        local_2b8->_data = local_2c0 << 0x10 | 0x6000126;
        break;
      case kUInt8:
      case kUInt16:
      case kUInt32:
        if (""[valueIndex] == 0xff) {
          EVar3 = DebugUtils::errored(3);
          return EVar3;
        }
        local_2d0 = FuncValuePack::operator[]
                              ((FuncValuePack *)
                               CONCAT17(in_stack_fffffffffffffb27,
                                        CONCAT16(in_stack_fffffffffffffb26,
                                                 CONCAT15(in_stack_fffffffffffffb25,
                                                          CONCAT14(in_stack_fffffffffffffb24,
                                                                   in_stack_fffffffffffffb20)))),
                               CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
        local_2d1 = 6;
        local_2d8 = (uint)""[valueIndex];
        local_2d9 = 0x27;
        local_2e0 = 0;
        local_2d0->_data = local_2d8 << 0x10 | 0x6000127;
        break;
      case kInt64:
      case _kIntEnd:
        if (""[valueIndex] == 0xff) {
          EVar3 = DebugUtils::errored(3);
          return EVar3;
        }
        local_2a0 = FuncValuePack::operator[]
                              ((FuncValuePack *)
                               CONCAT17(in_stack_fffffffffffffb27,
                                        CONCAT16(in_stack_fffffffffffffb26,
                                                 CONCAT15(in_stack_fffffffffffffb25,
                                                          CONCAT14(in_stack_fffffffffffffb24,
                                                                   in_stack_fffffffffffffb20)))),
                               CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
        local_2a1 = 7;
        local_2a8 = (uint)""[valueIndex];
        local_2a9 = typeId;
        local_2b0 = 0;
        local_2a0->_data = local_2a8 << 0x10 | 0x7000000 | (uint)typeId | 0x100;
        break;
      case _kFloatStart:
      case kFloat64:
        local_371 = arch;
        regType = kARM_VecQ;
        if ((arch & k32BitMask) != kUnknown) {
          regType = kX86_St;
        }
        local_2e8 = FuncValuePack::operator[]
                              ((FuncValuePack *)
                               CONCAT17(in_stack_fffffffffffffb27,
                                        CONCAT16(in_stack_fffffffffffffb26,
                                                 CONCAT15(in_stack_fffffffffffffb25,
                                                          CONCAT14(in_stack_fffffffffffffb24,
                                                                   in_stack_fffffffffffffb20)))),
                               CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
        local_2e9 = regType;
        local_2f0 = valueIndex;
        local_2f1 = typeId;
        local_2f8 = 0;
        local_2e8->_data = (uint)regType << 0x18 | valueIndex << 0x10 | (uint)typeId | 0x100;
        break;
      case _kBaseEnd:
        local_300 = FuncValuePack::operator[]
                              ((FuncValuePack *)
                               CONCAT17(in_stack_fffffffffffffb27,
                                        CONCAT16(in_stack_fffffffffffffb26,
                                                 CONCAT15(in_stack_fffffffffffffb25,
                                                          CONCAT14(in_stack_fffffffffffffb24,
                                                                   in_stack_fffffffffffffb20)))),
                               CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
        local_301 = 0x16;
        local_308 = valueIndex;
        local_309 = typeId;
        local_310 = 0;
        local_300->_data = valueIndex << 0x10 | 0x16000000 | (uint)typeId | 0x100;
        break;
      default:
        local_330 = FuncValuePack::operator[]
                              ((FuncValuePack *)
                               CONCAT17(in_stack_fffffffffffffb27,
                                        CONCAT16(in_stack_fffffffffffffb26,
                                                 CONCAT15(in_stack_fffffffffffffb25,
                                                          CONCAT14(in_stack_fffffffffffffb24,
                                                                   in_stack_fffffffffffffb20)))),
                               CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
        local_269 = typeId;
        if (typeId < _kVec256Start) {
          local_499 = 0xc;
        }
        else {
          local_49a = 0xd;
          if (_kVec256End < typeId) {
            local_49a = 0xe;
          }
          local_499 = local_49a;
        }
        local_331 = local_499;
        local_338 = valueIndex;
        local_339 = typeId;
        local_340 = 0;
        local_330->_data = (uint)local_499 << 0x18 | valueIndex << 0x10 | (uint)typeId | 0x100;
        break;
      case _kMmxStart:
      case _kMmxEnd:
        regType_1 = kExtra;
        regIndex = valueIndex;
        local_291 = arch;
        if ((arch & k32BitMask) == kUnknown) {
          local_278 = cc;
          local_481 = kARM_VecQ;
          if (cc->_strategy != kDefault) {
            local_481 = kARM_GpX;
          }
          regType_1 = local_481;
          local_280 = cc;
          if (cc->_strategy == kDefault) {
            local_488 = valueIndex;
          }
          else {
            local_488 = (uint)""[valueIndex];
          }
          regIndex = local_488;
          if (local_488 == 0xff) {
            EVar3 = DebugUtils::errored(3);
            return EVar3;
          }
        }
        local_318 = FuncValuePack::operator[]
                              ((FuncValuePack *)
                               CONCAT17(in_stack_fffffffffffffb27,
                                        CONCAT16(in_stack_fffffffffffffb26,
                                                 CONCAT15(in_stack_fffffffffffffb25,
                                                          CONCAT14(in_stack_fffffffffffffb24,
                                                                   in_stack_fffffffffffffb20)))),
                               CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
        local_319 = regType_1;
        local_320 = regIndex;
        local_321 = typeId;
        local_328 = 0;
        local_318->_data = (uint)regType_1 << 0x18 | regIndex << 0x10 | (uint)typeId | 0x100;
      }
    }
  }
  local_288 = cc;
  if ((cc->_strategy == kDefault) || (1 < (byte)(cc->_strategy - kX64Windows))) {
    gpzPos = 0;
    vecPos = 0;
    for (argIndex = 0; argIndex < argCount; argIndex = argIndex + 1) {
      unpackValues(func_local,(FuncValuePack *)(func_local + (ulong)argIndex * 0x10 + 0x9c));
      valueIndex_1 = 0;
      while ((valueIndex_1 < 4 &&
             (arg = FuncValuePack::operator[]
                              ((FuncValuePack *)
                               CONCAT17(in_stack_fffffffffffffb27,
                                        CONCAT16(in_stack_fffffffffffffb26,
                                                 CONCAT15(in_stack_fffffffffffffb25,
                                                          CONCAT14(in_stack_fffffffffffffb24,
                                                                   in_stack_fffffffffffffb20)))),
                               CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18)),
             local_258 = arg, arg->_data != 0))) {
        uVar1 = arg->_data;
        typeId_1 = (TypeId)uVar1;
        local_13a = 0x20;
        local_13b = 0x29;
        local_140 = uVar1 & 0xff;
        local_144 = 0x20;
        local_148 = 0x29;
        local_100 = &local_140;
        local_108 = &local_144;
        local_110 = &local_148;
        local_4a9 = local_140 < 0x20 || 0x29 < local_140;
        local_388 = arg;
        local_24b = typeId_1;
        local_139 = typeId_1;
        if (local_4a9) {
          local_18a = 0x2a;
          local_18b = 0x2c;
          local_190 = uVar1 & 0xff;
          local_194 = 0x2a;
          local_198 = 0x2c;
          local_88 = &local_190;
          local_90 = &local_194;
          local_98 = &local_198;
          local_20f = typeId_1;
          local_189 = typeId_1;
          if (local_190 < 0x2a || 0x2c < local_190) {
            local_1aa = 0x33;
            local_1ab = 100;
            local_1b0 = uVar1 & 0xff;
            local_1b4 = 0x33;
            local_1b8 = 100;
            local_58 = &local_1b0;
            local_60 = &local_1b4;
            local_68 = &local_1b8;
            local_20d = typeId_1;
            local_1a9 = typeId_1;
            if (local_1b0 < 0x33 || 100 < local_1b0) goto LAB_001d81fe;
          }
          regId_1 = 0xff;
          if (vecPos < 0x10) {
            local_401 = 1;
            pRVar4 = Support::Array<asmjit::v1_14::CallConv::RegOrder,_4UL>::
                     operator[]<asmjit::v1_14::RegGroup>
                               ((Array<asmjit::v1_14::CallConv::RegOrder,_4UL> *)
                                CONCAT17(in_stack_fffffffffffffb27,
                                         CONCAT16(in_stack_fffffffffffffb26,
                                                  CONCAT15(in_stack_fffffffffffffb25,
                                                           CONCAT14(in_stack_fffffffffffffb24,
                                                                    in_stack_fffffffffffffb20)))),
                                (RegGroup *)
                                CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
            regId_1 = (uint32_t)pRVar4->id[vecPos];
          }
          local_210 = typeId_1;
          local_179 = typeId_1;
          local_17a = 0x2a;
          local_17b = 0x2c;
          local_180 = (uint)typeId_1;
          local_184 = 0x2a;
          local_188 = 0x2c;
          local_a0 = &local_180;
          local_a8 = &local_184;
          local_b0 = &local_188;
          local_4b3 = local_180 < 0x2a || 0x2c < local_180;
          if (local_4b3) {
            local_1f0 = signature_local;
            if (signature_local->_vaIndex != 0xff) {
              local_208 = cc;
              local_20c = 8;
              bVar2 = Support::test<asmjit::v1_14::CallConvFlags,asmjit::v1_14::CallConvFlags>
                                (cc->_flags,kPassVecByStackIfVA);
              if (bVar2) {
                regId_1 = 0xff;
              }
            }
          }
          else {
            local_1f8 = cc;
            local_1fc = 4;
            bVar2 = Support::test<asmjit::v1_14::CallConvFlags,asmjit::v1_14::CallConvFlags>
                              (cc->_flags,kPassFloatsByVec);
            if (!bVar2) {
              regId_1 = 0xff;
            }
          }
          if (regId_1 == 0xff) {
            local_215 = typeId_1;
            size_1 = (uint32_t)(byte)TypeUtils::_typeData[(ulong)typeId_1 + 0x100];
            FuncValue::assignStackOffset
                      ((FuncValue *)
                       CONCAT17(in_stack_fffffffffffffb27,
                                CONCAT16(in_stack_fffffffffffffb26,
                                         CONCAT15(in_stack_fffffffffffffb25,
                                                  CONCAT14(in_stack_fffffffffffffb24,
                                                           in_stack_fffffffffffffb20)))),
                       in_stack_fffffffffffffb1c);
            stackOffset = size_1 + stackOffset;
          }
          else {
            local_358 = arg;
            local_359 = typeId_1;
            arg->_data = (uint)typeId_1;
            local_26a = typeId_1;
            if (typeId_1 < _kVec256Start) {
              in_stack_fffffffffffffb3f = 0xc;
            }
            else {
              in_stack_fffffffffffffb3d = 0xe;
              in_stack_fffffffffffffb3e = 0xd;
              in_stack_fffffffffffffb3f = in_stack_fffffffffffffb3e;
              if (_kVec256End < typeId_1) {
                in_stack_fffffffffffffb3e = 0xe;
                in_stack_fffffffffffffb3f = in_stack_fffffffffffffb3e;
              }
            }
            FuncValue::assignRegData
                      ((FuncValue *)
                       CONCAT17(in_stack_fffffffffffffb27,
                                CONCAT16(in_stack_fffffffffffffb26,
                                         CONCAT15(in_stack_fffffffffffffb25,
                                                  CONCAT14(in_stack_fffffffffffffb24,
                                                           in_stack_fffffffffffffb20)))),
                       (RegType)((uint)in_stack_fffffffffffffb1c >> 0x18),in_stack_fffffffffffffb18)
            ;
            local_238 = &regId_1;
            local_18 = local_238;
            FuncDetail::addUsedRegs
                      ((FuncDetail *)
                       CONCAT17(in_stack_fffffffffffffb3f,
                                CONCAT16(in_stack_fffffffffffffb3e,
                                         CONCAT15(in_stack_fffffffffffffb3d,
                                                  in_stack_fffffffffffffb38))),
                       (RegGroup)((ulong)in_stack_fffffffffffffb30 >> 0x38),
                       (RegMask)in_stack_fffffffffffffb30);
            vecPos = vecPos + 1;
          }
        }
        else {
          regId = 0xff;
          if (gpzPos < 0x10) {
            local_3f1 = 0;
            pRVar4 = Support::Array<asmjit::v1_14::CallConv::RegOrder,_4UL>::
                     operator[]<asmjit::v1_14::RegGroup>
                               ((Array<asmjit::v1_14::CallConv::RegOrder,_4UL> *)
                                CONCAT17(in_stack_fffffffffffffb27,
                                         CONCAT16(in_stack_fffffffffffffb26,
                                                  CONCAT15(in_stack_fffffffffffffb25,
                                                           CONCAT14(in_stack_fffffffffffffb24,
                                                                    in_stack_fffffffffffffb20)))),
                                (RegGroup *)
                                CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
            regId = (uint32_t)pRVar4->id[gpzPos];
          }
          if (regId == 0xff) {
            local_214 = typeId_1;
            local_3fc = (uint)(byte)TypeUtils::_typeData[(ulong)typeId_1 + 0x100];
            local_220 = &local_3fc;
            local_228 = &registerSize_local;
            local_4b0 = local_3fc;
            if (local_3fc < registerSize_local) {
              local_4b0 = registerSize_local;
            }
            size = local_4b0;
            FuncValue::assignStackOffset
                      ((FuncValue *)
                       CONCAT17(in_stack_fffffffffffffb27,
                                CONCAT16(in_stack_fffffffffffffb26,
                                         CONCAT15(in_stack_fffffffffffffb25,
                                                  CONCAT14(in_stack_fffffffffffffb24,
                                                           in_stack_fffffffffffffb20)))),
                       in_stack_fffffffffffffb1c);
            stackOffset = size + stackOffset;
          }
          else {
            local_249 = typeId_1;
            local_24a = 0x27;
            local_4aa = kARM_GpW;
            if (kUInt32 < typeId_1) {
              local_4aa = kARM_GpX;
            }
            regType_2 = local_4aa;
            FuncValue::assignRegData
                      ((FuncValue *)
                       CONCAT17(in_stack_fffffffffffffb27,
                                CONCAT16(in_stack_fffffffffffffb26,
                                         CONCAT15(in_stack_fffffffffffffb25,
                                                  CONCAT14(in_stack_fffffffffffffb24,
                                                           in_stack_fffffffffffffb20)))),
                       (RegType)((uint)in_stack_fffffffffffffb1c >> 0x18),in_stack_fffffffffffffb18)
            ;
            local_230 = &regId;
            local_20 = local_230;
            FuncDetail::addUsedRegs
                      ((FuncDetail *)
                       CONCAT17(in_stack_fffffffffffffb3f,
                                CONCAT16(in_stack_fffffffffffffb3e,
                                         CONCAT15(in_stack_fffffffffffffb3d,
                                                  in_stack_fffffffffffffb38))),
                       (RegGroup)((ulong)in_stack_fffffffffffffb30 >> 0x38),
                       (RegMask)in_stack_fffffffffffffb30);
            gpzPos = gpzPos + 1;
          }
        }
LAB_001d81fe:
        valueIndex_1 = valueIndex_1 + 1;
      }
    }
  }
  else {
    local_290 = cc;
    isVectorCall = cc->_strategy == kMaxValue;
    for (argIndex_1 = 0; argIndex_1 < argCount; argIndex_1 = argIndex_1 + 1) {
      unpackValues(func_local,(FuncValuePack *)(func_local + (ulong)argIndex_1 * 0x10 + 0x9c));
      valueIndex_2 = 0;
      while ((valueIndex_2 < 4 &&
             (pFVar5 = FuncValuePack::operator[]
                                 ((FuncValuePack *)
                                  CONCAT17(in_stack_fffffffffffffb27,
                                           CONCAT16(in_stack_fffffffffffffb26,
                                                    CONCAT15(in_stack_fffffffffffffb25,
                                                             CONCAT14(in_stack_fffffffffffffb24,
                                                                      in_stack_fffffffffffffb20)))),
                                  CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18)),
             arg_1 = pFVar5, local_260 = pFVar5, pFVar5->_data != 0))) {
        uVar1 = pFVar5->_data;
        typeId_2 = (TypeId)uVar1;
        size_2 = (uint32_t)(byte)TypeUtils::_typeData[(ulong)typeId_2 + 0x100];
        local_12a = 0x20;
        local_12b = 0x29;
        local_130 = uVar1 & 0xff;
        local_134 = 0x20;
        local_138 = 0x29;
        local_118 = &local_130;
        local_120 = &local_134;
        local_128 = &local_138;
        local_4d1 = local_130 < 0x20 || 0x29 < local_130;
        local_390 = pFVar5;
        local_24c = typeId_2;
        local_216 = typeId_2;
        local_129 = typeId_2;
        if (local_4d1) {
          local_1ca = 0x31;
          local_1cb = 0x32;
          local_1d0 = uVar1 & 0xff;
          local_1d4 = 0x31;
          local_1d8 = 0x32;
          local_28 = &local_1d0;
          local_30 = &local_1d4;
          local_38 = &local_1d8;
          local_4d2 = 0x30 < local_1d0 && local_1d0 < 0x33;
          local_1e5 = typeId_2;
          local_1c9 = typeId_2;
          if (local_4d2) goto LAB_001d8509;
          local_16a = 0x2a;
          local_16b = 0x2c;
          local_170 = uVar1 & 0xff;
          local_174 = 0x2a;
          local_178 = 0x2c;
          local_b8 = &local_170;
          local_c0 = &local_174;
          local_c8 = &local_178;
          local_4d7 = local_170 < 0x2a || 0x2c < local_170;
          local_211 = typeId_2;
          local_169 = typeId_2;
          if (local_4d7) {
            local_19a = 0x33;
            local_19b = 100;
            local_1a0 = uVar1 & 0xff;
            local_1a4 = 0x33;
            local_1a8 = 100;
            local_70 = &local_1a0;
            local_78 = &local_1a4;
            local_80 = &local_1a8;
            local_4d8 = 0x32 < local_1a0 && local_1a0 < 0x65;
            local_20e = typeId_2;
            local_199 = typeId_2;
            if (local_4d8) goto LAB_001d888b;
          }
          else {
LAB_001d888b:
            regId_3 = 0xff;
            if (argIndex_1 < 0x10) {
              pRVar4 = Support::Array<asmjit::v1_14::CallConv::RegOrder,_4UL>::
                       operator[]<asmjit::v1_14::RegGroup>
                                 ((Array<asmjit::v1_14::CallConv::RegOrder,_4UL> *)
                                  CONCAT17(in_stack_fffffffffffffb27,
                                           CONCAT16(in_stack_fffffffffffffb26,
                                                    CONCAT15(in_stack_fffffffffffffb25,
                                                             CONCAT14(in_stack_fffffffffffffb24,
                                                                      in_stack_fffffffffffffb20)))),
                                  (RegGroup *)
                                  CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
              regId_3 = (uint32_t)pRVar4->id[argIndex_1];
            }
            if (regId_3 != 0xff) {
              local_212 = typeId_2;
              local_159 = typeId_2;
              local_15a = 0x2a;
              local_15b = 0x2c;
              local_160 = (uint)typeId_2;
              local_164 = 0x2a;
              local_168 = 0x2c;
              local_d0 = &local_160;
              local_d8 = &local_164;
              local_e0 = &local_168;
              in_stack_fffffffffffffb27 = 0x29 < local_160 && local_160 < 0x2d;
              if (((bool)in_stack_fffffffffffffb27) || ((isVectorCall & 1U) != 0)) {
                local_26b = typeId_2;
                if (typeId_2 < _kVec256Start) {
                  in_stack_fffffffffffffb26 = 0xc;
                }
                else {
                  in_stack_fffffffffffffb24 = 0xe;
                  in_stack_fffffffffffffb25 = 0xd;
                  in_stack_fffffffffffffb26 = in_stack_fffffffffffffb25;
                  if (_kVec256End < typeId_2) {
                    in_stack_fffffffffffffb25 = 0xe;
                    in_stack_fffffffffffffb26 = in_stack_fffffffffffffb25;
                  }
                }
                FuncValue::assignRegData
                          ((FuncValue *)
                           CONCAT17(in_stack_fffffffffffffb27,
                                    CONCAT16(in_stack_fffffffffffffb26,
                                             CONCAT15(in_stack_fffffffffffffb25,
                                                      CONCAT14(in_stack_fffffffffffffb24,
                                                               in_stack_fffffffffffffb20)))),
                           (RegType)((uint)in_stack_fffffffffffffb1c >> 0x18),
                           in_stack_fffffffffffffb18);
                local_248 = &regId_3;
                local_8 = local_248;
                FuncDetail::addUsedRegs
                          ((FuncDetail *)
                           CONCAT17(in_stack_fffffffffffffb3f,
                                    CONCAT16(in_stack_fffffffffffffb3e,
                                             CONCAT15(in_stack_fffffffffffffb3d,
                                                      in_stack_fffffffffffffb38))),
                           (RegGroup)((ulong)pFVar5 >> 0x38),(RegMask)pFVar5);
                goto LAB_001d8c0e;
              }
            }
            local_213 = typeId_2;
            local_149 = typeId_2;
            local_14a = 0x2a;
            local_14b = 0x2c;
            local_150 = (uint)typeId_2;
            local_154 = 0x2a;
            local_158 = 0x2c;
            local_e8 = &local_150;
            local_f0 = &local_154;
            local_f8 = &local_158;
            uVar6 = (undefined3)in_stack_fffffffffffffb20;
            in_stack_fffffffffffffb20 = in_stack_fffffffffffffb20 & 0xffffff;
            if (0x29 < local_150) {
              in_stack_fffffffffffffb20 = CONCAT13(local_150 < 0x2d,uVar6);
            }
            if ((char)(in_stack_fffffffffffffb20 >> 0x18) == '\0') {
              pRVar4 = Support::Array<asmjit::v1_14::CallConv::RegOrder,_4UL>::
                       operator[]<asmjit::v1_14::RegGroup>
                                 ((Array<asmjit::v1_14::CallConv::RegOrder,_4UL> *)
                                  CONCAT17(in_stack_fffffffffffffb27,
                                           CONCAT16(in_stack_fffffffffffffb26,
                                                    CONCAT15(in_stack_fffffffffffffb25,
                                                             CONCAT14(in_stack_fffffffffffffb24,
                                                                      in_stack_fffffffffffffb20)))),
                                  (RegGroup *)
                                  CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
              if (pRVar4->id[argIndex_1] == 0xff) {
                FuncValue::assignStackOffset
                          ((FuncValue *)
                           CONCAT17(in_stack_fffffffffffffb27,
                                    CONCAT16(in_stack_fffffffffffffb26,
                                             CONCAT15(in_stack_fffffffffffffb25,
                                                      CONCAT14(in_stack_fffffffffffffb24,
                                                               in_stack_fffffffffffffb20)))),
                           in_stack_fffffffffffffb1c);
              }
              else {
                FuncValue::assignRegData
                          ((FuncValue *)
                           CONCAT17(in_stack_fffffffffffffb27,
                                    CONCAT16(in_stack_fffffffffffffb26,
                                             CONCAT15(in_stack_fffffffffffffb25,
                                                      CONCAT14(in_stack_fffffffffffffb24,
                                                               in_stack_fffffffffffffb20)))),
                           (RegType)((uint)in_stack_fffffffffffffb1c >> 0x18),
                           in_stack_fffffffffffffb18);
              }
              local_1e0 = arg_1;
              local_1e4 = 0x400;
              arg_1->_data = arg_1->_data | 0x400;
            }
            else {
              FuncValue::assignStackOffset
                        ((FuncValue *)
                         CONCAT17(in_stack_fffffffffffffb27,
                                  CONCAT16(in_stack_fffffffffffffb26,
                                           CONCAT15(in_stack_fffffffffffffb25,
                                                    CONCAT14(in_stack_fffffffffffffb24,
                                                             in_stack_fffffffffffffb20)))),
                         in_stack_fffffffffffffb1c);
            }
            stackOffset = stackOffset + 8;
          }
        }
        else {
LAB_001d8509:
          regId_2 = 0xff;
          if (argIndex_1 < 0x10) {
            local_42d = 0;
            pRVar4 = Support::Array<asmjit::v1_14::CallConv::RegOrder,_4UL>::
                     operator[]<asmjit::v1_14::RegGroup>
                               ((Array<asmjit::v1_14::CallConv::RegOrder,_4UL> *)
                                CONCAT17(in_stack_fffffffffffffb27,
                                         CONCAT16(in_stack_fffffffffffffb26,
                                                  CONCAT15(in_stack_fffffffffffffb25,
                                                           CONCAT14(in_stack_fffffffffffffb24,
                                                                    in_stack_fffffffffffffb20)))),
                                (RegGroup *)
                                CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
            regId_2 = (uint32_t)pRVar4->id[argIndex_1];
          }
          if (regId_2 == 0xff) {
            FuncValue::assignStackOffset
                      ((FuncValue *)
                       CONCAT17(in_stack_fffffffffffffb27,
                                CONCAT16(in_stack_fffffffffffffb26,
                                         CONCAT15(in_stack_fffffffffffffb25,
                                                  CONCAT14(in_stack_fffffffffffffb24,
                                                           in_stack_fffffffffffffb20)))),
                       in_stack_fffffffffffffb1c);
            stackOffset = stackOffset + 8;
          }
          else {
            bVar2 = false;
            if (size_2 < 5) {
              local_1e6 = typeId_2;
              local_1b9 = typeId_2;
              local_1ba = 0x31;
              local_1bb = 0x32;
              local_1c0 = (uint)typeId_2;
              local_1c4 = 0x31;
              local_1c8 = 0x32;
              local_40 = &local_1c0;
              local_48 = &local_1c4;
              local_50 = &local_1c8;
              bVar2 = local_1c0 < 0x31 || 0x32 < local_1c0;
            }
            local_4d5 = kARM_GpW;
            if (!bVar2) {
              local_4d5 = kARM_GpX;
            }
            regType_3 = local_4d5;
            FuncValue::assignRegData
                      ((FuncValue *)
                       CONCAT17(in_stack_fffffffffffffb27,
                                CONCAT16(in_stack_fffffffffffffb26,
                                         CONCAT15(in_stack_fffffffffffffb25,
                                                  CONCAT14(in_stack_fffffffffffffb24,
                                                           in_stack_fffffffffffffb20)))),
                       (RegType)((uint)in_stack_fffffffffffffb1c >> 0x18),in_stack_fffffffffffffb18)
            ;
            local_240 = &regId_2;
            local_10 = local_240;
            FuncDetail::addUsedRegs
                      ((FuncDetail *)
                       CONCAT17(in_stack_fffffffffffffb3f,
                                CONCAT16(in_stack_fffffffffffffb3e,
                                         CONCAT15(in_stack_fffffffffffffb3d,
                                                  in_stack_fffffffffffffb38))),
                       (RegGroup)((ulong)pFVar5 >> 0x38),(RegMask)pFVar5);
          }
        }
LAB_001d8c0e:
        valueIndex_2 = valueIndex_2 + 1;
      }
    }
  }
  *(uint32_t *)(func_local + 0x88) = stackOffset;
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE Error initFuncDetail(FuncDetail& func, const FuncSignature& signature, uint32_t registerSize) noexcept {
  const CallConv& cc = func.callConv();
  Arch arch = cc.arch();
  uint32_t stackOffset = cc._spillZoneSize;
  uint32_t argCount = func.argCount();

  // Up to two return values can be returned in GP registers.
  static const uint8_t gpReturnIndexes[4] = {
    uint8_t(Gp::kIdAx),
    uint8_t(Gp::kIdDx),
    uint8_t(BaseReg::kIdBad),
    uint8_t(BaseReg::kIdBad)
  };

  if (func.hasRet()) {
    unpackValues(func, func._rets);
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      TypeId typeId = func._rets[valueIndex].typeId();

      // Terminate at the first void type (end of the pack).
      if (typeId == TypeId::kVoid)
        break;

      switch (typeId) {
        case TypeId::kInt64:
        case TypeId::kUInt64: {
          if (gpReturnIndexes[valueIndex] != BaseReg::kIdBad)
            func._rets[valueIndex].initReg(RegType::kX86_Gpq, gpReturnIndexes[valueIndex], typeId);
          else
            return DebugUtils::errored(kErrorInvalidState);
          break;
        }

        case TypeId::kInt8:
        case TypeId::kInt16:
        case TypeId::kInt32: {
          if (gpReturnIndexes[valueIndex] != BaseReg::kIdBad)
            func._rets[valueIndex].initReg(RegType::kX86_Gpd, gpReturnIndexes[valueIndex], TypeId::kInt32);
          else
            return DebugUtils::errored(kErrorInvalidState);
          break;
        }

        case TypeId::kUInt8:
        case TypeId::kUInt16:
        case TypeId::kUInt32: {
          if (gpReturnIndexes[valueIndex] != BaseReg::kIdBad)
            func._rets[valueIndex].initReg(RegType::kX86_Gpd, gpReturnIndexes[valueIndex], TypeId::kUInt32);
          else
            return DebugUtils::errored(kErrorInvalidState);
          break;
        }

        case TypeId::kFloat32:
        case TypeId::kFloat64: {
          RegType regType = Environment::is32Bit(arch) ? RegType::kX86_St : RegType::kX86_Xmm;
          func._rets[valueIndex].initReg(regType, valueIndex, typeId);
          break;
        }

        case TypeId::kFloat80: {
          // 80-bit floats are always returned by FP0.
          func._rets[valueIndex].initReg(RegType::kX86_St, valueIndex, typeId);
          break;
        }

        case TypeId::kMmx32:
        case TypeId::kMmx64: {
          // MM registers are returned through XMM (SystemV) or GPQ (Win64).
          RegType regType = RegType::kX86_Mm;
          uint32_t regIndex = valueIndex;
          if (Environment::is64Bit(arch)) {
            regType = cc.strategy() == CallConvStrategy::kDefault ? RegType::kX86_Xmm : RegType::kX86_Gpq;
            regIndex = cc.strategy() == CallConvStrategy::kDefault ? valueIndex : gpReturnIndexes[valueIndex];

            if (regIndex == BaseReg::kIdBad)
              return DebugUtils::errored(kErrorInvalidState);
          }

          func._rets[valueIndex].initReg(regType, regIndex, typeId);
          break;
        }

        default: {
          func._rets[valueIndex].initReg(vecTypeIdToRegType(typeId), valueIndex, typeId);
          break;
        }
      }
    }
  }

  switch (cc.strategy()) {
    case CallConvStrategy::kDefault:
    default: {
      uint32_t gpzPos = 0;
      uint32_t vecPos = 0;

      for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
        unpackValues(func, func._args[argIndex]);

        for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
          FuncValue& arg = func._args[argIndex][valueIndex];

          // Terminate if there are no more arguments in the pack.
          if (!arg)
            break;

          TypeId typeId = arg.typeId();

          if (TypeUtils::isInt(typeId)) {
            uint32_t regId = BaseReg::kIdBad;

            if (gpzPos < CallConv::kMaxRegArgsPerGroup)
              regId = cc._passedOrder[RegGroup::kGp].id[gpzPos];

            if (regId != BaseReg::kIdBad) {
              RegType regType = typeId <= TypeId::kUInt32 ? RegType::kX86_Gpd : RegType::kX86_Gpq;
              arg.assignRegData(regType, regId);
              func.addUsedRegs(RegGroup::kGp, Support::bitMask(regId));
              gpzPos++;
            }
            else {
              uint32_t size = Support::max<uint32_t>(TypeUtils::sizeOf(typeId), registerSize);
              arg.assignStackOffset(int32_t(stackOffset));
              stackOffset += size;
            }
            continue;
          }

          if (TypeUtils::isFloat(typeId) || TypeUtils::isVec(typeId)) {
            uint32_t regId = BaseReg::kIdBad;

            if (vecPos < CallConv::kMaxRegArgsPerGroup)
              regId = cc._passedOrder[RegGroup::kVec].id[vecPos];

            if (TypeUtils::isFloat(typeId)) {
              // If this is a float, but `kFlagPassFloatsByVec` is false, we have to use stack instead. This should
              // be only used by 32-bit calling conventions.
              if (!cc.hasFlag(CallConvFlags::kPassFloatsByVec))
                regId = BaseReg::kIdBad;
            }
            else {
              // Pass vector registers via stack if this is a variable arguments function. This should be only used
              // by 32-bit calling conventions.
              if (signature.hasVarArgs() && cc.hasFlag(CallConvFlags::kPassVecByStackIfVA))
                regId = BaseReg::kIdBad;
            }

            if (regId != BaseReg::kIdBad) {
              arg.initTypeId(typeId);
              arg.assignRegData(vecTypeIdToRegType(typeId), regId);
              func.addUsedRegs(RegGroup::kVec, Support::bitMask(regId));
              vecPos++;
            }
            else {
              uint32_t size = TypeUtils::sizeOf(typeId);
              arg.assignStackOffset(int32_t(stackOffset));
              stackOffset += size;
            }
            continue;
          }
        }
      }
      break;
    }

    case CallConvStrategy::kX64Windows:
    case CallConvStrategy::kX64VectorCall: {
      // Both X64 and VectorCall behave similarly - arguments are indexed from left to right. The position of the
      // argument determines in which register the argument is allocated, so it's either GP or one of XMM/YMM/ZMM
      // registers.
      //
      //       [       X64       ] [VecCall]
      // Index: #0   #1   #2   #3   #4   #5
      //
      // GP   : RCX  RDX  R8   R9
      // VEC  : XMM0 XMM1 XMM2 XMM3 XMM4 XMM5
      //
      // For example function `f(int a, double b, int c, double d)` will be:
      //
      //        (a)  (b)  (c)  (d)
      //        RCX  XMM1 R8   XMM3
      //
      // Unused vector registers are used by HVA.
      bool isVectorCall = (cc.strategy() == CallConvStrategy::kX64VectorCall);

      for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
        unpackValues(func, func._args[argIndex]);

        for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
          FuncValue& arg = func._args[argIndex][valueIndex];

          // Terminate if there are no more arguments in the pack.
          if (!arg)
            break;

          TypeId typeId = arg.typeId();
          uint32_t size = TypeUtils::sizeOf(typeId);

          if (TypeUtils::isInt(typeId) || TypeUtils::isMmx(typeId)) {
            uint32_t regId = BaseReg::kIdBad;

            if (argIndex < CallConv::kMaxRegArgsPerGroup)
              regId = cc._passedOrder[RegGroup::kGp].id[argIndex];

            if (regId != BaseReg::kIdBad) {
              RegType regType = size <= 4 && !TypeUtils::isMmx(typeId) ? RegType::kX86_Gpd : RegType::kX86_Gpq;
              arg.assignRegData(regType, regId);
              func.addUsedRegs(RegGroup::kGp, Support::bitMask(regId));
            }
            else {
              arg.assignStackOffset(int32_t(stackOffset));
              stackOffset += 8;
            }
            continue;
          }

          if (TypeUtils::isFloat(typeId) || TypeUtils::isVec(typeId)) {
            uint32_t regId = BaseReg::kIdBad;

            if (argIndex < CallConv::kMaxRegArgsPerGroup)
              regId = cc._passedOrder[RegGroup::kVec].id[argIndex];

            if (regId != BaseReg::kIdBad) {
              // X64-ABI doesn't allow vector types (XMM|YMM|ZMM) to be passed via registers, however, VectorCall
              // was designed for that purpose.
              if (TypeUtils::isFloat(typeId) || isVectorCall) {
                RegType regType = vecTypeIdToRegType(typeId);
                arg.assignRegData(regType, regId);
                func.addUsedRegs(RegGroup::kVec, Support::bitMask(regId));
                continue;
              }
            }

            // Passed via stack if the argument is float/double or indirectly. The trap is - if the argument is
            // passed indirectly, the address can be passed via register, if the argument's index has GP one.
            if (TypeUtils::isFloat(typeId)) {
              arg.assignStackOffset(int32_t(stackOffset));
            }
            else {
              uint32_t gpRegId = cc._passedOrder[RegGroup::kGp].id[argIndex];
              if (gpRegId != BaseReg::kIdBad)
                arg.assignRegData(RegType::kX86_Gpq, gpRegId);
              else
                arg.assignStackOffset(int32_t(stackOffset));
              arg.addFlags(FuncValue::kFlagIsIndirect);
            }

            // Always 8 bytes (float/double/pointer).
            stackOffset += 8;
            continue;
          }
        }
      }
      break;
    }
  }

  func._argStackSize = stackOffset;
  return kErrorOk;
}